

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O1

void __thiscall sznet::net::EventLoopThreadPool::~EventLoopThreadPool(EventLoopThreadPool *this)

{
  pointer ppEVar1;
  pointer pcVar2;
  
  ppEVar1 = (this->m_loops).
            super__Vector_base<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1);
  }
  std::
  vector<std::unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>,_std::allocator<std::unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>_>_>
  ::~vector(&this->m_threads);
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_name).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

EventLoopThreadPool::~EventLoopThreadPool()
{
	// Don't delete m_baseLoop, it's stack variable
}